

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t midr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  ArchCPU_conflict2 *pAVar4;
  _Bool secure;
  uint cur_el;
  ARMCPU_conflict1 *cpu;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  pAVar4 = env_archcpu(env);
  iVar2 = arm_current_el(env);
  _Var1 = arm_is_secure(env);
  iVar3 = arm_feature(&pAVar4->env,0x20);
  if (((iVar3 == 0) || (_Var1)) || (iVar2 != 1)) {
    env_local = (CPUARMState_conflict *)raw_read(env,ri);
  }
  else {
    env_local = (CPUARMState_conflict *)(env->cp15).vpidr_el2;
  }
  return (uint64_t)env_local;
}

Assistant:

static uint64_t midr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    ARMCPU *cpu = env_archcpu(env);
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);

    if (arm_feature(&cpu->env, ARM_FEATURE_EL2) && !secure && cur_el == 1) {
        return env->cp15.vpidr_el2;
    }
    return raw_read(env, ri);
}